

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_oper.cpp
# Opt level: O2

void __thiscall FParser::OPremainder(FParser *this,svalue_t *result,int start,int n,int stop)

{
  int iVar1;
  int iVar2;
  svalue_t right;
  svalue_t left;
  
  left.string.Chars = FString::NullString.Nothing;
  right.type = 1;
  left.value.i = 0;
  FString::NullString.RefCount = FString::NullString.RefCount + 2;
  right.string.Chars = FString::NullString.Nothing;
  right.value.i = 0;
  left.type = right.type;
  EvaluateExpression(this,&left,start,n + -1);
  EvaluateExpression(this,&right,n + 1,stop);
  iVar1 = intvalue(&right);
  if (iVar1 == 0) {
    script_error("divide by zero\n");
  }
  else {
    result->type = 1;
    iVar2 = intvalue(&left);
    (result->value).i = iVar2 % iVar1;
  }
  FString::~FString(&right.string);
  FString::~FString(&left.string);
  return;
}

Assistant:

void FParser::OPremainder(svalue_t &result, int start, int n, int stop)
{
	svalue_t left, right;
	int ir;
	
	evaluate_leftnright(start, n, stop);
	
	if(!(ir = intvalue(right)))
		script_error("divide by zero\n");
	else
    {
		result.type = svt_int;
		result.value.i = intvalue(left) % ir;
    }
}